

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::WildcardPattern::~WildcardPattern(WildcardPattern *this)

{
  void *in_RDI;
  
  ~WildcardPattern((WildcardPattern *)0x1821d8);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

virtual ~WildcardPattern() = default;